

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O2

void __thiscall
google::protobuf::FieldDescriptorProto::set_type_name(FieldDescriptorProto *this,char *value)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (value == (char *)0x0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x14c6);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: value != NULL: ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,value,(allocator<char> *)&local_51);
  internal::ArenaStringPtr::SetNoArena
            (&this->type_name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
             (string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

inline void FieldDescriptorProto::set_type_name(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  set_has_type_name();
  type_name_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), ::std::string(value));
  // @@protoc_insertion_point(field_set_char:google.protobuf.FieldDescriptorProto.type_name)
}